

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessPreprocessorDirective
          (ConversionStream *this,iterator *Token)

{
  const_iterator __first;
  _List_node_base *p_Var1;
  bool bVar2;
  long lVar3;
  const_iterator __last;
  string PackMatrix;
  string Directive;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  __first._M_node = Token->_M_node;
  __last._M_node = __first._M_node;
  do {
    __last._M_node = (__last._M_node)->_M_next;
    if (__last._M_node == (_List_node_base *)&this->m_Tokens) break;
    lVar3 = std::__cxx11::string::find_first_of((char *)&__last._M_node[3]._M_prev,0x2d07b8);
  } while (lVar3 == -1);
  Parsing::RefinePreprocessorDirective(&local_50,(string *)&Token->_M_node[1]._M_prev);
  bVar2 = std::operator==(&local_50,"pragma");
  if (bVar2) {
    p_Var1 = Token->_M_node->_M_next;
    Token->_M_node = p_Var1;
    if (p_Var1 != __last._M_node) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &p_Var1[1]._M_prev,"pack_matrix");
      if (bVar2) {
        p_Var1 = Token->_M_node->_M_next;
        if ((p_Var1 == __last._M_node) || (*(int *)&p_Var1[1]._M_next != 0x135)) {
          std::__cxx11::string::string((string *)&local_70,"",&local_71);
        }
        else {
          p_Var1 = p_Var1->_M_next;
          if ((p_Var1 == __last._M_node) ||
             ((*(int *)&p_Var1[1]._M_next != 0xd4 && (*(int *)&p_Var1[1]._M_next != 0x102)))) {
            std::__cxx11::string::string((string *)&local_70,"",&local_71);
          }
          else if ((p_Var1->_M_next == __last._M_node) ||
                  (*(int *)&p_Var1->_M_next[1]._M_next != 0x136)) {
            std::__cxx11::string::string((string *)&local_70,"",&local_71);
          }
          else {
            std::__cxx11::string::string((string *)&local_70,(string *)&p_Var1[1]._M_prev);
          }
        }
        bVar2 = std::operator==(&local_70,"row_major");
        if (bVar2) {
          this->m_bUseRowMajorMatrices = true;
        }
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        erase(&this->m_Tokens,__first,__last);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  Token->_M_node = __last._M_node;
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessPreprocessorDirective(TokenListType::iterator& Token)
{
    const TokenListType::iterator DirectiveStart = Token;

    TokenListType::iterator DirectiveEnd = Token;
    ++DirectiveEnd;
    while (DirectiveEnd != m_Tokens.end() && DirectiveEnd->Delimiter.find_first_of("\r\n") == std::string::npos)
        ++DirectiveEnd;

    const std::string Directive = RefinePreprocessorDirective(Token->Literal);
    if (Directive == "pragma")
    {
        // # pragma pack_matrix( row_major )
        // ^

        ++Token;
        // # pragma pack_matrix( row_major )
        //          ^
        if (Token != DirectiveEnd && Token->Literal == "pack_matrix")
        {
            auto ParsePragmaPackMatrix = [](TokenListType::iterator Token, TokenListType::iterator End) -> std::string {
                // # pragma pack_matrix( row_major )
                //          ^

                ++Token;
                // # pragma pack_matrix( row_major )
                //                     ^
                if (Token == End || Token->Type != TokenType::OpenParen)
                    return "";

                ++Token;
                // # pragma pack_matrix( row_major )
                //                       ^
                if (Token == End || (Token->Type != TokenType::kw_row_major && Token->Type != TokenType::kw_column_major))
                    return "";

                const std::string& PackMatrix = Token->Literal;

                ++Token;
                // # pragma pack_matrix( row_major )
                //                                 ^
                if (Token == End || Token->Type != TokenType::ClosingParen)
                    return "";

                return PackMatrix;
            };
            const std::string PackMatrix = ParsePragmaPackMatrix(Token, DirectiveEnd);
            if (PackMatrix == "row_major")
                m_bUseRowMajorMatrices = true;

            // Delete the directive
            m_Tokens.erase(DirectiveStart, DirectiveEnd);
        }
    }

    // Go to the end of the directive
    Token = DirectiveEnd;
}